

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  string *psVar5;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0 [8];
  string flg;
  string *id;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_1a8;
  undefined1 local_188 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_168;
  char *local_148;
  char *modpath_flag;
  string local_138;
  string local_118 [8];
  string modflag;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string mod_dir;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *modout_flag;
  string *local_28;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalCommonGenerator *this_local;
  string *flags;
  
  modout_flag._7_1_ = 0;
  local_28 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalCommonGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_Fortran_MODOUT_FLAG",&local_59);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[7])(this,__return_storage_ptr__,pcVar3);
  }
  cmGeneratorTarget::GetFortranModuleDirectory
            ((string *)local_90,(cmGeneratorTarget *)config_local,&this->WorkingDirectory);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_d0,&this->super_cmLocalGenerator,&this->WorkingDirectory,(string *)local_90);
    cmOutputConverter::ConvertToOutputFormat
              (&local_b0,&(this->super_cmLocalGenerator).super_cmOutputConverter,&local_d0,SHELL);
    std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"CMAKE_Fortran_MODDIR_DEFAULT",
               (allocator<char> *)(modflag.field_2._M_local_buf + 0xf));
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_f0);
    std::__cxx11::string::operator=((string *)local_90,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)(modflag.field_2._M_local_buf + 0xf));
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"CMAKE_Fortran_MODDIR_FLAG",
               (allocator<char> *)((long)&modpath_flag + 7));
    psVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&local_138);
    std::__cxx11::string::string(local_118,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&modpath_flag + 7));
    std::__cxx11::string::operator+=(local_118,(string *)local_90);
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this,__return_storage_ptr__,local_118);
    std::__cxx11::string::~string(local_118);
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"CMAKE_Fortran_MODPATH_FLAG",
             (allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_148 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_188);
    psVar5 = config_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"C",(allocator<char> *)((long)&__range2 + 7));
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188,(cmGeneratorTarget *)psVar5,&local_1a8,local_28);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_188);
    id = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&id);
      if (!bVar2) break;
      flg.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      pcVar3 = local_148;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1f0,pcVar3,&local_1f1);
      std::allocator<char>::~allocator(&local_1f1);
      cmOutputConverter::ConvertToOutputFormat
                (&local_218,&(this->super_cmLocalGenerator).super_cmOutputConverter,
                 (string *)flg.field_2._8_8_,SHELL);
      std::__cxx11::string::operator+=(local_1f0,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this,__return_storage_ptr__,local_1f0);
      std::__cxx11::string::~string(local_1f0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_188);
  }
  modout_flag._7_1_ = 1;
  std::__cxx11::string::~string((string *)local_90);
  if ((modout_flag._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  if (const char* modout_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODOUT_FLAG")) {
    this->AppendFlags(flags, modout_flag);
  }

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->WorkingDirectory);
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->MaybeConvertToRelativePath(this->WorkingDirectory, mod_dir),
      cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    std::string modflag =
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG");
    modflag += mod_dir;
    this->AppendFlags(flags, modflag);
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (const char* modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::string const& id : includes) {
      std::string flg = modpath_flag;
      flg += this->ConvertToOutputFormat(id, cmOutputConverter::SHELL);
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}